

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::ParameterizedTestFactory<(anonymous_namespace)::SSETest_ExtremeValues_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::SSETest_ExtremeValues_Test> *this)

{
  SSETest *this_00;
  
  WithParamInterface<std::tuple<libaom_test::FuncParam<long(*)(unsigned_char_const*,int,unsigned_char_const*,int,int,int)>,int>>
  ::parameter_ = &this->parameter_;
  this_00 = (SSETest *)operator_new(0x50);
  anon_unknown.dwarf_1ccf507::SSETest::SSETest(this_00);
  (this_00->
  super_TestWithParam<std::tuple<libaom_test::FuncParam<long_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int,_int)>,_int>_>
  ).super_Test._vptr_Test = (_func_int **)&PTR__TestWithParam_00f64788;
  (this_00->
  super_TestWithParam<std::tuple<libaom_test::FuncParam<long_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int,_int)>,_int>_>
  ).
  super_WithParamInterface<std::tuple<libaom_test::FuncParam<long_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int,_int)>,_int>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__SSETest_ExtremeValues_Test_00f647c8;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }